

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * sqlite3ExprListAppend(Parse *pParse,ExprList *pList,Expr *pExpr)

{
  uint uVar1;
  int iVar2;
  ExprList_item *pEVar3;
  ExprList_item *p;
  
  if (pList == (ExprList *)0x0) {
    pList = (ExprList *)sqlite3DbMallocRaw((sqlite3 *)pParse,0x10);
    if (pList == (ExprList *)0x0) {
      pList = (ExprList *)0x0;
    }
    else {
      *(undefined8 *)pList = 0;
      pList->a = (ExprList_item *)0x0;
      p = (ExprList_item *)sqlite3DbMallocRaw((sqlite3 *)pParse,0x20);
      pList->a = p;
      if (p != (ExprList_item *)0x0) goto LAB_0014491f;
    }
LAB_00144944:
    sqlite3ExprDelete((sqlite3 *)pParse,pExpr);
    sqlite3ExprListDelete((sqlite3 *)pParse,pList);
    pList = (ExprList *)0x0;
  }
  else {
    uVar1 = pList->nExpr;
    p = pList->a;
    if ((uVar1 & uVar1 - 1) == 0) {
      p = (ExprList_item *)sqlite3DbRealloc((sqlite3 *)pParse,p,(long)(int)uVar1 << 6);
      if (p == (ExprList_item *)0x0) goto LAB_00144944;
      pList->a = p;
    }
LAB_0014491f:
    iVar2 = pList->nExpr;
    pList->nExpr = iVar2 + 1;
    p[iVar2].zName = (char *)0x0;
    (&p[iVar2].zName)[1] = (char *)0x0;
    pEVar3 = p + iVar2;
    pEVar3->sortOrder = '\0';
    *(undefined3 *)&pEVar3->field_0x19 = 0;
    pEVar3->u = (anon_union_4_2_6146edf4_for_u)0x0;
    p[iVar2].pExpr = pExpr;
  }
  return pList;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppend(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  sqlite3 *db = pParse->db;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(ExprList) );
    if( pList==0 ){
      goto no_mem;
    }
    pList->a = sqlite3DbMallocRaw(db, sizeof(pList->a[0]));
    if( pList->a==0 ) goto no_mem;
  }else if( (pList->nExpr & (pList->nExpr-1))==0 ){
    struct ExprList_item *a;
    assert( pList->nExpr>0 );
    a = sqlite3DbRealloc(db, pList->a, pList->nExpr*2*sizeof(pList->a[0]));
    if( a==0 ){
      goto no_mem;
    }
    pList->a = a;
  }
  assert( pList->a!=0 );
  if( 1 ){
    struct ExprList_item *pItem = &pList->a[pList->nExpr++];
    memset(pItem, 0, sizeof(*pItem));
    pItem->pExpr = pExpr;
  }
  return pList;

no_mem:     
  /* Avoid leaking memory if malloc has failed. */
  sqlite3ExprDelete(db, pExpr);
  sqlite3ExprListDelete(db, pList);
  return 0;
}